

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  cmMessenger *messenger;
  reference __lhs;
  size_type sVar5;
  cmake *this_00;
  reference ppcVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_5b0;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_5a8;
  iterator sdi;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
  local_580;
  const_iterator local_578;
  int local_570 [4];
  undefined1 local_560 [8];
  cmListFileFunction project;
  string local_4e0;
  reference local_4c0;
  cmListFileFunction *func_2;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2_1;
  undefined1 local_498 [7];
  bool hasProject;
  allocator<char> local_471;
  string local_470;
  _Self local_450;
  _Self local_448;
  reference local_440;
  cmListFileFunction *func_1;
  iterator __end4;
  iterator __begin4;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range4;
  allocator<char> local_409;
  value_type local_408;
  _Base_ptr local_3e8;
  undefined1 local_3e0;
  allocator<char> local_3d1;
  value_type local_3d0;
  _Base_ptr local_3b0;
  undefined1 local_3a8;
  allocator<char> local_399;
  value_type local_398;
  _Base_ptr local_378;
  undefined1 local_370;
  allocator<char> local_361;
  value_type local_360;
  _Base_ptr local_340;
  undefined1 local_338;
  allocator<char> local_329;
  value_type local_328;
  _Base_ptr local_308;
  undefined1 local_300;
  allocator<char> local_2f1;
  value_type local_2f0;
  _Base_ptr local_2d0;
  undefined1 local_2c8;
  allocator<char> local_2b9;
  value_type local_2b8;
  _Base_ptr local_298;
  undefined1 local_290;
  allocator<char> local_281;
  value_type local_280;
  _Base_ptr local_260;
  undefined1 local_258;
  allocator<char> local_249;
  value_type local_248;
  _Base_ptr local_228;
  undefined1 local_220;
  allocator<char> local_211;
  value_type local_210;
  _Base_ptr local_1f0;
  undefined1 local_1e8;
  allocator<char> local_1d9;
  value_type local_1d8;
  undefined1 local_1b8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedCommands;
  bool isProblem;
  cmListFileFunction *func;
  iterator __end2;
  iterator __begin2;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range2;
  undefined1 local_158 [3];
  bool hasVersion;
  cmListFile listFile;
  string local_118;
  cmStateDirectory local_f8;
  undefined1 local_d0 [8];
  string filesDir;
  BuildsystemFileScope scope;
  cmStateDirectory local_58;
  undefined1 local_30 [8];
  string currentStart;
  cmMakefile *this_local;
  
  currentStart.field_2._8_8_ = this;
  cmStateSnapshot::GetDirectory(&local_58,&this->StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_58);
  std::__cxx11::string::string((string *)local_30,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_30,"/CMakeLists.txt");
  cmListFileBacktrace::Push((cmListFileBacktrace *)&scope.ReportError,(string *)&this->Backtrace);
  cmListFileBacktrace::operator=(&this->Backtrace,(cmListFileBacktrace *)&scope.ReportError);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&scope.ReportError);
  BuildsystemFileScope::BuildsystemFileScope
            ((BuildsystemFileScope *)((long)&filesDir.field_2 + 8),this);
  cmStateSnapshot::GetDirectory(&local_f8,&this->StateSnapshot);
  psVar3 = cmStateDirectory::GetCurrentBinary_abi_cxx11_(&local_f8);
  std::__cxx11::string::string((string *)local_d0,(string *)psVar3);
  std::__cxx11::string::operator+=((string *)local_d0,"/CMakeFiles");
  cmsys::SystemTools::MakeDirectory((string *)local_d0,(mode_t *)0x0);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_30,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0x606,"void cmMakefile::Configure()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"CMAKE_PARENT_LIST_FILE",
             (allocator<char> *)(listFile.Filename.field_2._M_local_buf + 0xf));
  pcVar4 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_118,pcVar4);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator
            ((allocator<char> *)(listFile.Filename.field_2._M_local_buf + 0xf));
  cmListFile::cmListFile((cmListFile *)local_158);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  messenger = GetMessenger(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)local_158,pcVar4,messenger,&this->Backtrace);
  if (bVar1) {
    bVar1 = IsRootMakefile(this);
    if (bVar1) {
      bVar1 = false;
      __end2 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          local_158);
      func = (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158
                       );
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                         *)&func), bVar2) {
        __lhs = __gnu_cxx::
                __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                ::operator*(&__end2);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"cmake_minimum_required");
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&__end2);
      }
      if (!bVar1) {
        allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        sVar5 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                          ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                           local_158);
        if (sVar5 < 0x1e) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"project",&local_1d9);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_1d8);
          local_1f0 = (_Base_ptr)pVar7.first._M_node;
          local_1e8 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"set",&local_211);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_210);
          local_228 = (_Base_ptr)pVar7.first._M_node;
          local_220 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_210);
          std::allocator<char>::~allocator(&local_211);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"if",&local_249);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_248);
          local_260 = (_Base_ptr)pVar7.first._M_node;
          local_258 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,"endif",&local_281);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_280);
          local_298 = (_Base_ptr)pVar7.first._M_node;
          local_290 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"else",&local_2b9)
          ;
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_2b8);
          local_2d0 = (_Base_ptr)pVar7.first._M_node;
          local_2c8 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_2b8);
          std::allocator<char>::~allocator(&local_2b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,"elseif",&local_2f1);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_2f0);
          local_308 = (_Base_ptr)pVar7.first._M_node;
          local_300 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_2f0);
          std::allocator<char>::~allocator(&local_2f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_328,"add_executable",&local_329);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_328);
          local_340 = (_Base_ptr)pVar7.first._M_node;
          local_338 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_328);
          std::allocator<char>::~allocator(&local_329);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_360,"add_library",&local_361);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_360);
          local_378 = (_Base_ptr)pVar7.first._M_node;
          local_370 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_360);
          std::allocator<char>::~allocator(&local_361);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_398,"target_link_libraries",&local_399);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_398);
          local_3b0 = (_Base_ptr)pVar7.first._M_node;
          local_3a8 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator(&local_399);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"option",&local_3d1);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_1b8,&local_3d0);
          local_3e8 = (_Base_ptr)pVar7.first._M_node;
          local_3e0 = pVar7.second;
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator(&local_3d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"message",&local_409);
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1b8,&local_408);
          std::__cxx11::string::~string((string *)&local_408);
          std::allocator<char>::~allocator(&local_409);
          allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
          __end4 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                             ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              local_158);
          func_1 = (cmListFileFunction *)
                   std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                             ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                              local_158);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                             *)&func_1), bVar1) {
            local_440 = __gnu_cxx::
                        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                        ::operator*(&__end4);
            local_448._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1b8,(key_type *)local_440);
            local_450._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1b8);
            bVar1 = std::operator==(&local_448,&local_450);
            if (bVar1) {
              allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
              break;
            }
            __gnu_cxx::
            __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
            ::operator++(&__end4);
          }
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1b8);
        }
        if ((allowedCommands._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
          SetCheckCMP0000(this,true);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,"2.4",&local_471);
          std::__cxx11::string::string((string *)local_498);
          SetPolicyVersion(this,&local_470,(string *)local_498);
          std::__cxx11::string::~string((string *)local_498);
          std::__cxx11::string::~string((string *)&local_470);
          std::allocator<char>::~allocator(&local_471);
        }
      }
      bVar1 = false;
      __end2_1 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                           ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                            local_158);
      func_2 = (cmListFileFunction *)
               std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                         ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)
                          local_158);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                 *)&func_2), bVar2) {
        local_4c0 = __gnu_cxx::
                    __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                    ::operator*(&__end2_1);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_4c0,"project");
        if (bVar2) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
        ::operator++(&__end2_1);
      }
      if (!bVar1) {
        this_00 = GetCMakeInstance(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4e0,
                   "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
                   ,(allocator<char> *)
                    ((long)&project.Arguments.
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_4e0,&this->Backtrace);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&project.Arguments.
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        cmListFileFunction::cmListFileFunction((cmListFileFunction *)local_560);
        std::__cxx11::string::operator=((string *)local_560,"project");
        local_570[3] = 0;
        local_570[2] = 0;
        std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
        emplace_back<char_const(&)[8],cmListFileArgument::Delimiter,int>
                  ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                   &project.super_cmCommandContext.EndCol,(char (*) [8])0x821777,
                   (Delimiter *)(local_570 + 3),local_570 + 2);
        local_570[1] = 0;
        local_570[0] = 0;
        std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
        emplace_back<char_const(&)[35],cmListFileArgument::Delimiter,int>
                  ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
                   &project.super_cmCommandContext.EndCol,
                   (char (*) [35])"__CMAKE_INJECTED_PROJECT_COMMAND__",(Delimiter *)(local_570 + 1),
                   local_570);
        local_580._M_current =
             (cmListFileFunction *)
             std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                       ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158
                       );
        __gnu_cxx::
        __normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
        ::__normal_iterator<cmListFileFunction*>
                  ((__normal_iterator<cmListFileFunction_const*,std::vector<cmListFileFunction,std::allocator<cmListFileFunction>>>
                    *)&local_578,&local_580);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                  ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)local_158,
                   local_578,(value_type *)local_560);
        cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_560);
      }
    }
    ReadListFile(this,(cmListFile *)local_158,(string *)local_30);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      BuildsystemFileScope::Quiet((BuildsystemFileScope *)((long)&filesDir.field_2 + 8));
    }
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi,
               &this->UnConfiguredDirectories);
    local_5a8._M_current =
         (cmMakefile **)
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin
                   ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    while( true ) {
      local_5b0._M_current =
           (cmMakefile **)
           std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end
                     ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
      bVar1 = __gnu_cxx::operator!=(&local_5a8,&local_5b0);
      if (!bVar1) break;
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_5a8);
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar6)->StateSnapshot);
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_5a8);
      ConfigureSubDirectory(this,*ppcVar6);
      __gnu_cxx::
      __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
      operator++(&local_5a8);
    }
    AddCMakeDependFilesFromUser(this);
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
  }
  cmListFile::~cmListFile((cmListFile *)local_158);
  std::__cxx11::string::~string((string *)local_d0);
  BuildsystemFileScope::~BuildsystemFileScope((BuildsystemFileScope *)((long)&filesDir.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += "/CMakeFiles";
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (allowedCommands.find(func.Name.Lower) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4", std::string());
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project;
      project.Name.Lower = "project";
      project.Arguments.emplace_back("Project", cmListFileArgument::Unquoted,
                                     0);
      project.Arguments.emplace_back("__CMAKE_INJECTED_PROJECT_COMMAND__",
                                     cmListFileArgument::Unquoted, 0);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}